

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void * __thiscall
pstd::pmr::monotonic_buffer_resource::do_allocate
          (monotonic_buffer_resource *this,size_t bytes,size_t align)

{
  size_t *psVar1;
  MemoryBlock *pMVar2;
  ulong uVar3;
  int iVar4;
  undefined4 extraout_var;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  void *pvVar7;
  ulong uVar8;
  size_t sVar9;
  ulong uVar10;
  undefined4 extraout_var_00;
  
  uVar10 = this->blockSize;
  if (uVar10 < bytes) {
    iVar4 = (*this->upstreamResource->_vptr_memory_resource[2])(this->upstreamResource,bytes,align);
    p_Var5 = (_List_node_base *)operator_new(0x20);
    p_Var5[1]._M_next = (_List_node_base *)CONCAT44(extraout_var,iVar4);
    p_Var5[1]._M_prev = (_List_node_base *)bytes;
    std::__detail::_List_node_base::_M_hook(p_Var5);
    psVar1 = &(this->usedBlocks).
              super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    p_Var5 = (this->usedBlocks).
             super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
             ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
  }
  else {
    uVar8 = this->currentBlockPos;
    if (uVar8 % align != 0) {
      uVar8 = (uVar8 + align) - uVar8 % align;
      this->currentBlockPos = uVar8;
    }
    uVar3 = (this->currentBlock).size;
    pMVar2 = &this->currentBlock;
    if (uVar3 < uVar8 + bytes) {
      if (uVar3 != 0) {
        p_Var6 = (_List_node_base *)operator_new(0x20);
        p_Var5 = (_List_node_base *)(this->currentBlock).size;
        p_Var6[1]._M_next = (_List_node_base *)pMVar2->ptr;
        p_Var6[1]._M_prev = p_Var5;
        std::__detail::_List_node_base::_M_hook(p_Var6);
        psVar1 = &(this->usedBlocks).
                  super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        pMVar2->ptr = (void *)0x0;
        (this->currentBlock).size = 0;
        uVar10 = this->blockSize;
      }
      if (uVar10 == 0) {
        sVar9 = 0;
        pvVar7 = (void *)0x0;
      }
      else {
        iVar4 = (*this->upstreamResource->_vptr_memory_resource[2])
                          (this->upstreamResource,uVar10,0x10);
        pvVar7 = (void *)CONCAT44(extraout_var_00,iVar4);
        sVar9 = this->blockSize;
      }
      (this->currentBlock).ptr = pvVar7;
      (this->currentBlock).size = sVar9;
      uVar8 = 0;
    }
    else {
      pvVar7 = pMVar2->ptr;
    }
    p_Var5 = (_List_node_base *)((long)pvVar7 + uVar8);
    this->currentBlockPos = bytes + uVar8;
  }
  return p_Var5;
}

Assistant:

void *do_allocate(size_t bytes, size_t align) override {
        if (bytes > blockSize) {
            // We've got a big allocation; let the current block be so that
            // smaller allocations have a chance at using up more of it.
            usedBlocks.push_back(
                MemoryBlock{upstreamResource->allocate(bytes, align), bytes});
            return usedBlocks.back().ptr;
        }

        if ((currentBlockPos % align) != 0)
            currentBlockPos += align - (currentBlockPos % align);
        DCHECK_EQ(0, currentBlockPos % align);

        if (currentBlockPos + bytes > currentBlock.size) {
            // Add current block to _usedBlocks_ list
            if (currentBlock.size) {
                usedBlocks.push_back(currentBlock);
                currentBlock = {};
            }

            currentBlock = {
                upstreamResource->allocate(blockSize, alignof(std::max_align_t)),
                blockSize};
            currentBlockPos = 0;
        }

        void *ptr = (char *)currentBlock.ptr + currentBlockPos;
        currentBlockPos += bytes;
        return ptr;
    }